

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileByName
          (MergedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  uint uVar1;
  size_type sVar2;
  reference ppDVar3;
  int local_2c;
  int i;
  FileDescriptorProto *output_local;
  string *filename_local;
  MergedDescriptorDatabase *this_local;
  
  local_2c = 0;
  while( true ) {
    sVar2 = std::
            vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ::size(&this->sources_);
    if (sVar2 <= (ulong)(long)local_2c) {
      return false;
    }
    ppDVar3 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,(long)local_2c);
    uVar1 = (*(*ppDVar3)->_vptr_DescriptorDatabase[2])(*ppDVar3,filename,output);
    if ((uVar1 & 1) != 0) break;
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool MergedDescriptorDatabase::FindFileByName(
    const string& filename,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileByName(filename, output)) {
      return true;
    }
  }
  return false;
}